

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::GetColumnWidth(int column_index)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  float fVar3;
  float w;
  ImGuiWindow *window;
  int column_index_local;
  
  pIVar1 = GetCurrentWindowRead();
  window._4_4_ = column_index;
  if (column_index < 0) {
    window._4_4_ = (pIVar1->DC).ColumnsCurrent;
  }
  fVar2 = GetColumnOffset(window._4_4_ + 1);
  fVar3 = GetColumnOffset(window._4_4_);
  return fVar2 - fVar3;
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    float w = GetColumnOffset(column_index+1) - GetColumnOffset(column_index);
    return w;
}